

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  undefined1 extraout_var [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 auVar16 [16];
  Mat local_88;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar10 = 0;
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar12 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar12;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_88.h = 0;
  local_88.c = 0;
  local_88.cstep = 0;
  local_88.elemsize = 0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.data = (void *)0x0;
  local_88.refcount = (int *)0x0;
  Mat::create(&local_88,4,uVar2 * uVar1,4);
  auVar14._0_4_ = (float)iVar5;
  auVar14._4_12_ = extraout_var;
  local_58 = auVar14._0_4_ * 0.5;
  pvVar3 = (this->ratios).data;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = uVar10;
  }
  auVar15 = auVar14;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
    fVar12 = *(float *)((long)pvVar3 + uVar8 * 4);
    auVar15 = rsqrtss(auVar15,ZEXT416((uint)fVar12));
    fVar13 = auVar15._0_4_;
    fVar13 = roundf(fVar13 * -0.5 * auVar14._0_4_ * (fVar12 * fVar13 * fVar13 + -3.0));
    pvVar4 = (this->scales).data;
    local_48 = (float)(int)fVar13;
    fStack_44 = (float)(int)extraout_var_00._0_4_;
    fStack_40 = (float)(int)extraout_var_00._4_4_;
    fStack_3c = (float)(int)extraout_var_00._8_4_;
    fVar12 = roundf(fVar12 * local_48);
    auVar16._0_4_ = (float)(int)fVar12;
    auVar16._4_4_ = (float)(int)extraout_var_01._0_4_;
    auVar16._8_4_ = (float)(int)extraout_var_01._4_4_;
    auVar16._12_4_ = (float)(int)extraout_var_01._8_4_;
    pfVar6 = (float *)(uVar10 * (long)local_88.w + (long)local_88.data);
    auVar15 = auVar16;
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      fVar12 = *(float *)((long)pvVar4 + uVar7 * 4) * 0.5;
      auVar15._0_4_ = fVar12 * local_48;
      auVar15._4_4_ = fVar12 * auVar16._0_4_;
      auVar15._8_4_ = fVar12 * fStack_44;
      auVar15._12_4_ = fVar12 * auVar16._4_4_;
      *pfVar6 = local_58 - auVar15._0_4_;
      pfVar6[1] = fStack_54 - auVar15._4_4_;
      pfVar6[2] = auVar15._0_4_ + fStack_50;
      pfVar6[3] = auVar15._4_4_ + fStack_4c;
      pfVar6 = pfVar6 + local_88.w;
    }
    uVar10 = uVar10 + (long)(int)uVar2 * 4;
  }
  Mat::operator=(&this->anchors,&local_88);
  Mat::~Mat(&local_88);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}